

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O3

void __thiscall
ConfidentialTxOut_DefaultConstractor_Test::TestBody(ConfidentialTxOut_DefaultConstractor_Test *this)

{
  bool *pbVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  AssertHelperData *pAVar4;
  char *pcVar5;
  ulong uVar6;
  size_t sVar7;
  Amount AVar8;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_7;
  ConfidentialTxOutReference txout_ref;
  ConfidentialTxOut txout;
  undefined1 local_298 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  undefined1 local_278 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268 [3];
  AssertHelper local_238;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  ConfidentialTxOutReference local_228;
  int local_12c;
  ConfidentialTxOut local_128;
  
  cfd::core::ConfidentialTxOut::ConfidentialTxOut(&local_128);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&local_228,&local_128.asset_);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            ((string *)local_278,(ConfidentialAssetId *)&local_228);
  pcVar5 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_298,"txout.GetAsset().GetHex().c_str()","\"\"",(char *)local_278,"");
  if (local_278 != (undefined1  [8])local_268) {
    operator_delete((void *)local_278);
  }
  local_228.super_AbstractTxOutReference._vptr_AbstractTxOutReference =
       (_func_int **)&PTR__ConfidentialAssetId_0068d228;
  if ((AssertHelperData *)local_228.super_AbstractTxOutReference.value_.amount_ !=
      (AssertHelperData *)0x0) {
    operator_delete((void *)local_228.super_AbstractTxOutReference.value_.amount_);
  }
  if (local_298[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_228);
    if (sStack_290.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = *(char **)sStack_290.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x2f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_278,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_278);
    if (local_228.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_228.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0))
      {
        (**(code **)(*local_228.super_AbstractTxOutReference._vptr_AbstractTxOutReference + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_298 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&local_228,&local_128.confidential_value_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_
            ((string *)local_278,(ConfidentialValue *)&local_228);
  pcVar5 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_298,"txout.GetConfidentialValue().GetHex().c_str()","\"\"",
             (char *)local_278,"");
  if (local_278 != (undefined1  [8])local_268) {
    operator_delete((void *)local_278);
  }
  local_228.super_AbstractTxOutReference._vptr_AbstractTxOutReference =
       (_func_int **)&PTR__ConfidentialValue_0068d0c0;
  if ((AssertHelperData *)local_228.super_AbstractTxOutReference.value_.amount_ !=
      (AssertHelperData *)0x0) {
    operator_delete((void *)local_228.super_AbstractTxOutReference.value_.amount_);
  }
  if (local_298[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_228);
    if (sStack_290.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = *(char **)sStack_290.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x30,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_278,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_278);
    if (local_228.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_228.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0))
      {
        (**(code **)(*local_228.super_AbstractTxOutReference._vptr_AbstractTxOutReference + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_298 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::AbstractTxOut::GetLockingScript((Script *)&local_228,&local_128.super_AbstractTxOut);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_278,(Script *)&local_228);
  pcVar5 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_298,"txout.GetLockingScript().GetHex().c_str()","\"\"",
             (char *)local_278,"");
  if (local_278 != (undefined1  [8])local_268) {
    operator_delete((void *)local_278);
  }
  cfd::core::Script::~Script((Script *)&local_228);
  if (local_298[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_228);
    if (sStack_290.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = *(char **)sStack_290.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x31,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_278,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_278);
    if (local_228.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_228.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0))
      {
        (**(code **)(*local_228.super_AbstractTxOutReference._vptr_AbstractTxOutReference + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_298 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)&local_228,&local_128.nonce_)
  ;
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_
            ((string *)local_278,(ConfidentialNonce *)&local_228);
  pcVar5 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_298,"txout.GetNonce().GetHex().c_str()","\"\"",(char *)local_278,"");
  if (local_278 != (undefined1  [8])local_268) {
    operator_delete((void *)local_278);
  }
  local_228.super_AbstractTxOutReference._vptr_AbstractTxOutReference =
       (_func_int **)&PTR__ConfidentialNonce_0068d410;
  if ((AssertHelperData *)local_228.super_AbstractTxOutReference.value_.amount_ !=
      (AssertHelperData *)0x0) {
    operator_delete((void *)local_228.super_AbstractTxOutReference.value_.amount_);
  }
  if (local_298[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_228);
    if (sStack_290.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = *(char **)sStack_290.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x32,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_278,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_278);
    if (local_228.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_228.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0))
      {
        (**(code **)(*local_228.super_AbstractTxOutReference._vptr_AbstractTxOutReference + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_298 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_278 = (undefined1  [8])0x0;
  sStack_270.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_268[0]._M_allocated_capacity = 0;
  uVar6 = (long)local_128.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_128.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar6 == 0) {
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    sVar7 = 0;
  }
  else {
    if ((long)uVar6 < 0) {
      std::__throw_bad_alloc();
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             operator_new(uVar6);
    sVar7 = (long)local_128.range_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_128.range_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_268[0]._0_8_ = uVar6 + (long)pbVar3;
  local_278 = (undefined1  [8])pbVar3;
  if (local_128.range_proof_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_128.range_proof_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    sStack_270.ptr_ = pbVar3;
    memmove(pbVar3,local_128.range_proof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar7);
  }
  sStack_270.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&(pbVar3->_M_dataplus)._M_p + sVar7);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&local_228,(ByteData *)local_278);
  pcVar5 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_298,"txout.GetRangeProof().GetHex().c_str()","\"\"",
             (char *)local_228.super_AbstractTxOutReference._vptr_AbstractTxOutReference,"");
  pbVar1 = &local_228.super_AbstractTxOutReference.value_.ignore_check_;
  if (local_228.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)pbVar1) {
    operator_delete(local_228.super_AbstractTxOutReference._vptr_AbstractTxOutReference);
  }
  if (local_278 != (undefined1  [8])0x0) {
    operator_delete((void *)local_278);
  }
  if (local_298[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_228);
    if (sStack_290.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = *(char **)sStack_290.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x33,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_278,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_278);
    if (local_228.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_228.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0))
      {
        (**(code **)(*local_228.super_AbstractTxOutReference._vptr_AbstractTxOutReference + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_298 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_278 = (undefined1  [8])0x0;
  sStack_270.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_268[0]._M_allocated_capacity = 0;
  uVar6 = (long)local_128.surjection_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_128.surjection_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar6 == 0) {
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    sVar7 = 0;
  }
  else {
    if ((long)uVar6 < 0) {
      std::__throw_bad_alloc();
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             operator_new(uVar6);
    sVar7 = (long)local_128.surjection_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_128.surjection_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_268[0]._0_8_ = uVar6 + (long)pbVar3;
  local_278 = (undefined1  [8])pbVar3;
  if (local_128.surjection_proof_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_128.surjection_proof_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sStack_270.ptr_ = pbVar3;
    memmove(pbVar3,local_128.surjection_proof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar7);
  }
  sStack_270.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&(pbVar3->_M_dataplus)._M_p + sVar7);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&local_228,(ByteData *)local_278);
  pcVar5 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_298,"txout.GetSurjectionProof().GetHex().c_str()","\"\"",
             (char *)local_228.super_AbstractTxOutReference._vptr_AbstractTxOutReference,"");
  if (local_228.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)pbVar1) {
    operator_delete(local_228.super_AbstractTxOutReference._vptr_AbstractTxOutReference);
  }
  if (local_278 != (undefined1  [8])0x0) {
    operator_delete((void *)local_278);
  }
  if (local_298[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_228);
    if (sStack_290.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = *(char **)sStack_290.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x34,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_278,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_278);
    if (local_228.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_228.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0))
      {
        (**(code **)(*local_228.super_AbstractTxOutReference._vptr_AbstractTxOutReference + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_298 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  AVar8 = cfd::core::AbstractTxOut::GetValue(&local_128.super_AbstractTxOut);
  local_278 = (undefined1  [8])AVar8.amount_;
  sStack_270.ptr_._0_1_ = AVar8.ignore_check_;
  local_298 = (undefined1  [8])cfd::core::Amount::GetSatoshiValue((Amount *)local_278);
  local_238.data_ = (AssertHelperData *)((ulong)local_238.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&local_228,"txout.GetValue().GetSatoshiValue()","0",(long *)local_298,
             (int *)&local_238);
  if ((char)local_228.super_AbstractTxOutReference._vptr_AbstractTxOutReference == '\0') {
    testing::Message::Message((Message *)local_278);
    if ((AssertHelperData *)local_228.super_AbstractTxOutReference.value_.amount_ ==
        (AssertHelperData *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)(Type *)local_228.super_AbstractTxOutReference.value_.amount_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x35,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
    if (local_278 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_278 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_278 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_228.super_AbstractTxOutReference.value_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialTxOutReference::ConfidentialTxOutReference(&local_228,&local_128);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_278,&local_228.asset_);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            ((string *)local_298,(ConfidentialAssetId *)local_278);
  pcVar5 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_238,"txout_ref.GetAsset().GetHex().c_str()","\"\"",(char *)local_298
             ,"");
  if (local_298 != (undefined1  [8])&local_288) {
    operator_delete((void *)local_298);
  }
  local_278 = (undefined1  [8])&PTR__ConfidentialAssetId_0068d228;
  if (sStack_270.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(sStack_270.ptr_);
  }
  if (local_238.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_278);
    if (local_230.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = ((local_230.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x38,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
    if (local_278 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_278 != (undefined1  [8])0x0)) {
        (**(code **)(*(undefined **)local_278 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_230,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)local_278,&local_228.confidential_value_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_
            ((string *)local_298,(ConfidentialValue *)local_278);
  pcVar5 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_238,"txout_ref.GetConfidentialValue().GetHex().c_str()","\"\"",
             (char *)local_298,"");
  if (local_298 != (undefined1  [8])&local_288) {
    operator_delete((void *)local_298);
  }
  local_278 = (undefined1  [8])&PTR__ConfidentialValue_0068d0c0;
  if (sStack_270.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(sStack_270.ptr_);
  }
  if (local_238.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_278);
    if (local_230.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = ((local_230.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x39,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
    if (local_278 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_278 != (undefined1  [8])0x0)) {
        (**(code **)(*(undefined **)local_278 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_230,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::Script
            ((Script *)local_278,&local_228.super_AbstractTxOutReference.locking_script_);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_298,(Script *)local_278);
  pcVar5 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_238,"txout_ref.GetLockingScript().GetHex().c_str()","\"\"",
             (char *)local_298,"");
  if (local_298 != (undefined1  [8])&local_288) {
    operator_delete((void *)local_298);
  }
  cfd::core::Script::~Script((Script *)local_278);
  if (local_238.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_278);
    if (local_230.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = ((local_230.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x3a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
    if (local_278 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_278 != (undefined1  [8])0x0)) {
        (**(code **)(*(undefined **)local_278 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_230,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)local_278,&local_228.nonce_);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_
            ((string *)local_298,(ConfidentialNonce *)local_278);
  pcVar5 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_238,"txout_ref.GetNonce().GetHex().c_str()","\"\"",(char *)local_298
             ,"");
  if (local_298 != (undefined1  [8])&local_288) {
    operator_delete((void *)local_298);
  }
  local_278 = (undefined1  [8])&PTR__ConfidentialNonce_0068d410;
  if (sStack_270.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(sStack_270.ptr_);
  }
  if (local_238.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_278);
    if (local_230.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = ((local_230.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x3b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
    if (local_278 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_278 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_278 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_230,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_298 = (undefined1  [8])0x0;
  sStack_290.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_288._M_allocated_capacity = 0;
  uVar6 = (long)local_228.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_228.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar6 == 0) {
    pAVar4 = (AssertHelperData *)0x0;
    sVar7 = 0;
  }
  else {
    if ((long)uVar6 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar4 = (AssertHelperData *)operator_new(uVar6);
    sVar7 = (long)local_228.range_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_228.range_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_288._M_allocated_capacity = uVar6 + (long)pAVar4;
  local_298 = (undefined1  [8])pAVar4;
  if (local_228.range_proof_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_228.range_proof_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    sStack_290.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar4;
    memmove(pAVar4,local_228.range_proof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar7);
  }
  sStack_290.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&pAVar4->type + sVar7);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_278,(ByteData *)local_298);
  pcVar5 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_238,"txout_ref.GetRangeProof().GetHex().c_str()","\"\"",
             (char *)local_278,"");
  if (local_278 != (undefined1  [8])local_268) {
    operator_delete((void *)local_278);
  }
  if (local_298 != (undefined1  [8])0x0) {
    operator_delete((void *)local_298);
  }
  if (local_238.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_278);
    if (local_230.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = ((local_230.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x3c,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
    if (local_278 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_278 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_278 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_230,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_298 = (undefined1  [8])0x0;
  sStack_290.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_288._M_allocated_capacity = 0;
  uVar6 = (long)local_228.surjection_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_228.surjection_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar6 == 0) {
    pAVar4 = (AssertHelperData *)0x0;
    sVar7 = 0;
  }
  else {
    if ((long)uVar6 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar4 = (AssertHelperData *)operator_new(uVar6);
    sVar7 = (long)local_228.surjection_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_228.surjection_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_288._M_allocated_capacity = uVar6 + (long)pAVar4;
  local_298 = (undefined1  [8])pAVar4;
  if (local_228.surjection_proof_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_228.surjection_proof_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sStack_290.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar4;
    memmove(pAVar4,local_228.surjection_proof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar7);
  }
  sStack_290.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&pAVar4->type + sVar7);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_278,(ByteData *)local_298);
  pcVar5 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_238,"txout_ref.GetSurjectionProof().GetHex().c_str()","\"\"",
             (char *)local_278,"");
  if (local_278 != (undefined1  [8])local_268) {
    operator_delete((void *)local_278);
  }
  if (local_298 != (undefined1  [8])0x0) {
    operator_delete((void *)local_298);
  }
  if (local_238.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_278);
    if (local_230.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = ((local_230.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x3d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
    if (local_278 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_278 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_278 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_230,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_298 = (undefined1  [8])local_228.super_AbstractTxOutReference.value_.amount_;
  sStack_290.ptr_._0_1_ = local_228.super_AbstractTxOutReference.value_.ignore_check_;
  local_238.data_ = (AssertHelperData *)cfd::core::Amount::GetSatoshiValue((Amount *)local_298);
  local_12c = 0;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_278,"txout_ref.GetValue().GetSatoshiValue()","0",(long *)&local_238,
             &local_12c);
  if (local_278[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_298);
    if (sStack_270.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((sStack_270.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x3e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_238,(Message *)local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    if (local_298 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_298 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_298 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_270,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_228);
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut(&local_128);
  return;
}

Assistant:

TEST(ConfidentialTxOut, DefaultConstractor) {
  // default constructor
  ConfidentialTxOut txout;
  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetConfidentialValue().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 0);

  ConfidentialTxOutReference txout_ref(txout);
  EXPECT_STREQ(txout_ref.GetAsset().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetConfidentialValue().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetRangeProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_EQ(txout_ref.GetValue().GetSatoshiValue(), 0);
}